

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O1

void memory_tree_ns::collect_labels_from_leaf
               (memory_tree *b,uint32_t cn,v_array<unsigned_int> *leaf_labs)

{
  float fVar1;
  node *pnVar2;
  example *peVar3;
  wclass *pwVar4;
  float *pfVar5;
  uint *puVar6;
  float *pfVar7;
  wclass *pwVar8;
  ulong uVar9;
  bool bVar10;
  uint32_t lab;
  float local_3c;
  long local_38;
  
  local_38 = (ulong)cn * 9;
  if ((b->nodes)._begin[cn].internal != -1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"something is wrong, it should be a leaf node",0x2c);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
    std::ostream::put(-0x18);
    std::ostream::flush();
  }
  v_array<unsigned_int>::clear(leaf_labs);
  pnVar2 = (b->nodes)._begin;
  puVar6 = (&(pnVar2->examples_index)._begin)[local_38];
  if ((&(pnVar2->examples_index)._end)[local_38] != puVar6) {
    uVar9 = 0;
    do {
      peVar3 = (b->examples)._begin[puVar6[uVar9]];
      pwVar4 = (peVar3->l).cs.costs._end;
      for (pwVar8 = (wclass *)(peVar3->l).multilabels.label_v._begin; pwVar8 != pwVar4;
          pwVar8 = (wclass *)&pwVar8->class_index) {
        local_3c = pwVar8->x;
        pfVar7 = (float *)leaf_labs->_begin;
        pfVar5 = (float *)leaf_labs->_end;
        bVar10 = pfVar7 != pfVar5;
        if (bVar10) {
          fVar1 = *pfVar7;
          while (fVar1 != local_3c) {
            pfVar7 = pfVar7 + 1;
            bVar10 = pfVar7 != pfVar5;
            if (pfVar7 == pfVar5) break;
            fVar1 = *pfVar7;
          }
        }
        if (!bVar10) {
          v_array<unsigned_int>::push_back(leaf_labs,(uint *)&local_3c);
        }
      }
      uVar9 = uVar9 + 1;
      pnVar2 = (b->nodes)._begin;
      puVar6 = (&(pnVar2->examples_index)._begin)[local_38];
    } while (uVar9 < (ulong)((long)(&(pnVar2->examples_index)._end)[local_38] - (long)puVar6 >> 2));
  }
  return;
}

Assistant:

void collect_labels_from_leaf(memory_tree& b, const uint32_t cn, v_array<uint32_t>& leaf_labs){
        if (b.nodes[cn].internal != -1)
            cout<<"something is wrong, it should be a leaf node"<<endl;
    
        leaf_labs.clear();
        for (size_t i = 0; i < b.nodes[cn].examples_index.size(); i++){ //scan through each memory in the leaf
            uint32_t loc = b.nodes[cn].examples_index[i];
            for (uint32_t lab: b.examples[loc]->l.multilabels.label_v){ //scan through each label:
                if (v_array_contains(leaf_labs, lab) == false)
                    leaf_labs.push_back(lab); 
            }
        }
    }